

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_aggregate_context(sqlite3_context *p,int nByte)

{
  Mem *p_00;
  char *__s;
  
  if ((short)p->pMem->flags < 0) {
    return p->pMem->z;
  }
  p_00 = p->pMem;
  if (nByte < 1) {
    if ((p_00->flags & 0x9000) == 0) {
      p_00->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(p_00);
    }
    p_00->z = (char *)0x0;
  }
  else {
    if (p_00->szMalloc < nByte) {
      sqlite3VdbeMemGrow(p_00,nByte,0);
      __s = p_00->z;
    }
    else {
      __s = p_00->zMalloc;
      p_00->z = __s;
    }
    p_00->flags = 0x8000;
    p_00->u = (MemValue)p->pFunc;
    if (__s != (char *)0x0) {
      memset(__s,0,(ulong)(uint)nByte);
      return p_00->z;
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_aggregate_context(sqlite3_context *p, int nByte){
  assert( p && p->pFunc && p->pFunc->xFinalize );
  assert( sqlite3_mutex_held(p->pOut->db->mutex) );
  testcase( nByte<0 );
  if( (p->pMem->flags & MEM_Agg)==0 ){
    return createAggContext(p, nByte);
  }else{
    return (void*)p->pMem->z;
  }
}